

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O3

void __thiscall amrex::Geometry::define(Geometry *this,Box *dom,RealBox *rb,int coord,int *is_per)

{
  CoordType *pCVar1;
  Real RVar2;
  Real RVar3;
  Real RVar4;
  Real RVar5;
  Real RVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  RealBox *pRVar10;
  long lVar11;
  
  Setup(rb,coord,is_per);
  pCVar1 = (CoordType *)**(undefined8 **)(DAT_0071a208 + -8);
  if (coord == -1) {
    coord = *pCVar1;
  }
  (this->super_CoordSys).c_sys = coord;
  lVar11 = 0;
  if (is_per == (int *)0x0) {
    do {
      *(undefined1 *)((long)(this->super_CoordSys).inv_dx + lVar11 + 0x19) =
           *(undefined1 *)((long)pCVar1 + lVar11 + 0x51);
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
  }
  else {
    do {
      *(bool *)((long)(this->super_CoordSys).inv_dx + lVar11 + 0x19) = is_per[lVar11] != 0;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 3);
  }
  pRVar10 = (RealBox *)(pCVar1 + 0x16);
  if (rb != (RealBox *)0x0) {
    pRVar10 = rb;
  }
  RVar2 = pRVar10->xlo[0];
  RVar3 = pRVar10->xlo[1];
  RVar4 = pRVar10->xlo[2];
  RVar5 = pRVar10->xhi[0];
  RVar6 = pRVar10->xhi[2];
  (this->prob_domain).xhi[1] = pRVar10->xhi[1];
  (this->prob_domain).xhi[2] = RVar6;
  (this->prob_domain).xlo[2] = RVar4;
  (this->prob_domain).xhi[0] = RVar5;
  (this->prob_domain).xlo[0] = RVar2;
  (this->prob_domain).xlo[1] = RVar3;
  uVar7 = *(undefined8 *)((dom->smallend).vect + 2);
  uVar8 = *(undefined8 *)(dom->bigend).vect;
  uVar9 = *(undefined8 *)((dom->bigend).vect + 2);
  *(undefined8 *)(this->domain).smallend.vect = *(undefined8 *)(dom->smallend).vect;
  *(undefined8 *)((this->domain).smallend.vect + 2) = uVar7;
  *(undefined8 *)(this->domain).bigend.vect = uVar8;
  *(undefined8 *)((this->domain).bigend.vect + 2) = uVar9;
  (this->super_CoordSys).ok = true;
  computeRoundoffDomain(this);
  return;
}

Assistant:

void
Geometry::define (const Box& dom, const RealBox* rb, int coord,
                  int const* is_per) noexcept
{
    Setup(rb,coord,is_per);

    Geometry* gg = AMReX::top()->getDefaultGeometry();

    if (coord == -1) {
        c_sys = gg->Coord();
    } else {
        c_sys = static_cast<CoordType>(coord);
    }

    if (is_per == nullptr) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            is_periodic[idim] = gg->isPeriodic(idim);
        }
    } else {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            is_periodic[idim] = is_per[idim];
        }
    }

    if (rb == nullptr) {
        prob_domain = gg->ProbDomain();
    } else {
        prob_domain = *rb;
    }

    domain = dom;
    ok     = true;

    computeRoundoffDomain();
}